

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::ExplicitNonAnsiPortSyntax::setChild
          (ExplicitNonAnsiPortSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  logic_error *this_00;
  long *plVar4;
  size_type *psVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (4 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar4 = (long *)std::__cxx11::string::append((char *)local_90);
    local_d0._M_dataplus._M_p = (pointer)*plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = plVar4[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
    }
    local_d0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x15b8);
    std::operator+(&local_50,&local_d0,&local_70);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = (long *)*plVar4;
    plVar6 = plVar4 + 2;
    if (local_b0 == plVar6) {
      local_a0 = *plVar6;
      lStack_98 = plVar4[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar6;
    }
    local_a8 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_f0 = (long *)*plVar4;
    plVar6 = plVar4 + 2;
    if (local_f0 == plVar6) {
      local_e0 = *plVar6;
      lStack_d8 = plVar4[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar6;
    }
    local_e8 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    lVar8 = 0x18;
    lVar7 = 0x10;
    break;
  case 1:
    lVar8 = 0x28;
    lVar7 = 0x20;
    break;
  case 2:
    lVar8 = 0x38;
    lVar7 = 0x30;
    break;
  case 3:
    ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    lVar8 = 0x40;
    if (*ppSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar3 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar3 = *ppSVar1;
      if ((pSVar3->kind & ~TokenList) != PortConcatenation) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,
                   "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::PortExpressionSyntax]");
      }
    }
    goto LAB_002ad99f;
  case 4:
    lVar8 = 0x50;
    lVar7 = 0x48;
  }
  pvVar2 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                     ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  pSVar3 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)pvVar2->info;
  *(undefined8 *)((long)&(this->super_NonAnsiPortSyntax).super_SyntaxNode.parent + lVar7) =
       *(undefined8 *)pvVar2;
LAB_002ad99f:
  *(variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *)
   ((long)&(this->super_NonAnsiPortSyntax).super_SyntaxNode.parent + lVar8) = pSVar3;
  return;
}

Assistant:

void ExplicitNonAnsiPortSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: dot = child.token(); return;
        case 1: name = child.token(); return;
        case 2: openParen = child.token(); return;
        case 3: expr = child.node() ? &child.node()->as<PortExpressionSyntax>() : nullptr; return;
        case 4: closeParen = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}